

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

string * Imf_3_3::viewFromChannelName(string *channel,StringVector *multiView)

{
  size_type sVar1;
  const_reference pvVar2;
  reference this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *viewName;
  StringVector s;
  StringVector *in_stack_ffffffffffffff50;
  string *psVar3;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  string *this_00;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_5d [13];
  string local_50 [32];
  string local_30;
  
  this_00 = local_50;
  local_30.field_2._8_8_ = in_RDX;
  psVar3 = in_RDI;
  std::__cxx11::string::string(this_00,in_RSI);
  anon_unknown_5::parseString(psVar3,(char)((ulong)in_RSI >> 0x38));
  std::__cxx11::string::~string(local_50);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_30);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(allocator<char> *)this_00);
    std::allocator<char>::~allocator(local_5d);
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_30);
    if (sVar1 == 1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_30.field_2._8_8_,0);
      std::__cxx11::string::string((string *)in_RDI,(string *)pvVar2);
    }
    else {
      psVar3 = &local_30;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)psVar3);
      this = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)psVar3,sVar1 - 2);
      in_stack_ffffffffffffff64 = anon_unknown_5::viewNum(psVar3,in_stack_ffffffffffffff50);
      if (in_stack_ffffffffffffff64 < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,in_stack_ffffffffffffff88,(allocator<char> *)this_00);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
      }
      else {
        std::__cxx11::string::string((string *)in_RDI,(string *)this);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return in_RDI;
}

Assistant:

string
viewFromChannelName (const string& channel, const StringVector& multiView)
{
    //
    // Given the name of a channel, return the name of the view to
    // which it belongs.
    //

    //
    // View name is penultimate section of name separated by periods ('.'s)
    //

    StringVector s = parseString (channel, '.');

    if (s.size () == 0) return ""; // nothing in, nothing out

    if (s.size () == 1)
    {
        //
        // Return default view name.
        // The rules say ALL channels with no periods
        // in the name belong to the default view.
        //

        return multiView[0];
    }
    else
    {
        //
        // size >= 2 - the last part is the channel name,
        // the next-to-last part is the view name.
        // Check if that part of the name really is
        // a valid view and, if it is, return it.
        //

        const string& viewName = s[s.size () - 2];

        if (viewNum (viewName, multiView) >= 0)
            return viewName;
        else
            return ""; // not associated with any particular view
    }
}